

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

void __thiscall Quest_Context::BeginState(Quest_Context *this,string *name,State *state)

{
  map<short,_std::shared_ptr<Dialog>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
  *this_00;
  Quest_Context *pQVar1;
  bool bVar2;
  int iVar3;
  iterator __position;
  reference pvVar4;
  iterator iVar5;
  Dialog *pDVar6;
  _Elt_pointer pAVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_bool> pVar8;
  short vendor_id;
  Quest_Context *local_228;
  _Elt_pointer local_220;
  _Map_pointer local_218;
  _Elt_pointer local_210;
  size_type local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  string local_1f8;
  string function_name;
  Action action;
  
  local_220 = (_Elt_pointer)state;
  std::__cxx11::string::_M_assign((string *)&this->state_desc);
  __position._M_node = (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_228 = this;
LAB_0016a132:
  do {
    pQVar1 = local_228;
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->progress)._M_t._M_impl.super__Rb_tree_header) break;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (__position._M_node + 1),"d");
    if (bVar2) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (__position._M_node + 1),"c");
      if (bVar2) {
        __position = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                     ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,short>,std::_Select1st<std::pair<std::__cxx11::string_const,short>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,short>>>
                                         *)&this->progress,__position);
        goto LAB_0016a132;
      }
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
  this_00 = &local_228->dialogs;
  std::
  _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
  ::clear(&this_00->_M_t);
  if ((pQVar1->quest->quest->info).disabled == false) {
    pAVar7 = (((deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)((long)local_220 + 0x98))->
             super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    local_210 = (((deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)((long)local_220 + 0x98)
                 )->super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>)._M_impl.
                super__Deque_impl_data._M_start._M_last;
    local_218 = (((deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)((long)local_220 + 0x98)
                 )->super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>)._M_impl.
                super__Deque_impl_data._M_start._M_node;
    local_220 = (((deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *)((long)local_220 + 0x98)
                 )->super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
    local_228 = (Quest_Context *)&(local_228->dialogs)._M_t._M_impl.super__Rb_tree_header;
    while (pAVar7 != local_220) {
      EOPlus::Action::Action(&action,pAVar7);
      std::__cxx11::string::string((string *)&function_name,(string *)&action.expr.function);
      bVar2 = std::operator==(&function_name,"addnpctext");
      if (bVar2) {
LAB_0016a238:
        pvVar4 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                           (&action.expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data._M_start,0);
        iVar3 = util::variant::GetInt(pvVar4);
        vendor_id = (short)iVar3;
        iVar5 = std::
                _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Dialog>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Dialog>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Dialog>_>_>_>
                ::find(&this_00->_M_t,&vendor_id);
        if ((Quest_Context *)iVar5._M_node == local_228) {
          pDVar6 = (Dialog *)operator_new(0x80);
          Dialog::Dialog(pDVar6);
          std::__shared_ptr<Dialog,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Dialog,void>
                    ((__shared_ptr<Dialog,(__gnu_cxx::_Lock_policy)2> *)&local_208,pDVar6);
          local_1f8._M_dataplus._M_p._0_2_ = vendor_id;
          local_1f8._M_string_length = local_208;
          local_1f8.field_2._M_allocated_capacity = (size_type)_Stack_200._M_pi;
          local_208 = 0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pVar8 = std::
                  _Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                  ::_M_emplace_unique<std::pair<short,std::shared_ptr<Dialog>>>
                            ((_Rb_tree<short,std::pair<short_const,std::shared_ptr<Dialog>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Dialog>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Dialog>>>>
                              *)this_00,(pair<short,_std::shared_ptr<Dialog>_> *)&local_1f8);
          iVar5._M_node = (_Base_ptr)pVar8.first._M_node;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_1f8.field_2._M_allocated_capacity);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_200);
        }
        bVar2 = std::operator==(&function_name,"addnpctext");
        if (bVar2) {
          pDVar6 = (Dialog *)iVar5._M_node[1]._M_parent;
          pvVar4 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                             (&action.expr.args.
                               super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                               _M_impl.super__Deque_impl_data._M_start,1);
          util::variant::GetString_abi_cxx11_(&local_1f8,pvVar4);
          Dialog::AddPage(pDVar6,&local_1f8);
        }
        else {
          bVar2 = std::operator==(&function_name,"addnpcinput");
          if (!bVar2) goto LAB_0016a376;
          pDVar6 = (Dialog *)iVar5._M_node[1]._M_parent;
          pvVar4 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                             (&action.expr.args.
                               super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                               _M_impl.super__Deque_impl_data._M_start,1);
          iVar3 = util::variant::GetInt(pvVar4);
          pvVar4 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                             (&action.expr.args.
                               super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                               _M_impl.super__Deque_impl_data._M_start,2);
          util::variant::GetString_abi_cxx11_(&local_1f8,pvVar4);
          Dialog::AddLink(pDVar6,iVar3,&local_1f8);
        }
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      else {
        bVar2 = std::operator==(&function_name,"addnpcinput");
        if (bVar2) goto LAB_0016a238;
      }
LAB_0016a376:
      std::__cxx11::string::~string((string *)&function_name);
      EOPlus::Action::~Action(&action);
      pAVar7 = pAVar7 + 1;
      if (pAVar7 == local_210) {
        pAVar7 = local_218[1];
        local_218 = local_218 + 1;
        local_210 = pAVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void Quest_Context::BeginState(const std::string& name, const EOPlus::State& state)
{
	this->state_desc = state.desc;

	for (auto it = this->progress.begin(); it != this->progress.end(); )
	{
		if (it->first != "d" && it->first != "c")
			it = this->progress.erase(it);
		else
			++it;
	}

	this->dialogs.clear();

	if (this->quest->Disabled())
		return;

	UTIL_FOREACH(state.actions, action)
	{
		std::string function_name = action.expr.function;

		if (function_name == "addnpctext" || function_name == "addnpcinput")
		{
			short vendor_id = int(action.expr.args[0]);
			auto it = this->dialogs.find(vendor_id);

			if (it == this->dialogs.end())
				it = this->dialogs.insert(std::make_pair(vendor_id, std::shared_ptr<Dialog>(new Dialog()))).first;

			if (function_name == "addnpctext")
				it->second->AddPage(std::string(action.expr.args[1]));
			else if (function_name == "addnpcinput")
				it->second->AddLink(int(action.expr.args[1]), std::string(action.expr.args[2]));
		}
	}
}